

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void * embree::threadStartup(ThreadStartupData *parg)

{
  undefined8 *in_RDI;
  
  MXCSR = MXCSR | 0x8040;
  (*(code *)*in_RDI)(in_RDI[1]);
  if (in_RDI != (undefined8 *)0x0) {
    operator_delete(in_RDI);
  }
  return (void *)0x0;
}

Assistant:

static void* threadStartup(ThreadStartupData* parg)
  {
    _mm_setcsr(_mm_getcsr() | /*FTZ:*/ (1<<15) | /*DAZ:*/ (1<<6));
    
    /*! Mac OS X does not support setting affinity at thread creation time */
#if defined(__MACOSX__)
    if (parg->affinity >= 0)
	setAffinity(parg->affinity);
#endif

    parg->f(parg->arg);
    delete parg;
    return nullptr;
  }